

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::renderMultisampledImage
               (Context *context,CaseDef *caseDef,VkImage colorImage)

{
  undefined4 uVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  undefined4 uVar3;
  VkImageSubresourceRange subresourceRange;
  undefined1 auVar4 [16];
  Handle<(vk::HandleType)17> renderPass;
  Handle<(vk::HandleType)17> pipelineLayout;
  Handle<(vk::HandleType)14> fragmentModule;
  Handle<(vk::HandleType)14> vertexModule;
  deUint32 dVar5;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)13>_> *ptr;
  ProgramBinary *pPVar6;
  long lVar7;
  int iVar8;
  size_t bufferSize;
  ulong __n;
  int layerNdx;
  long lVar9;
  value_type local_2a8;
  undefined8 local_298;
  VkAllocationCallbacks *pVStack_290;
  long local_288;
  pointer pVStack_280;
  ulong local_278;
  pointer pVStack_270;
  undefined8 local_268;
  RefBase<vk::VkCommandBuffer_s_*> local_258;
  undefined1 local_238 [32];
  VkImageLayout VStack_218;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  VkImageSubresourceRange res;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_178;
  VkQueue local_158;
  undefined8 local_150;
  Allocator *local_148;
  Vector<int,_2> local_140;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_138;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_d8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_b8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_78;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_58;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_158 = Context::getUniversalQueue(context);
  dVar5 = Context::getUniversalQueueFamilyIndex(context);
  local_148 = Context::getDefaultAllocator(context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_2a8.depthStencil,vk,device,2,dVar5,
             (VkAllocationCallbacks *)0x0);
  local_58.m_data.deleter.m_device = local_298;
  local_58.m_data.deleter.m_allocator = pVStack_290;
  local_58.m_data.object.m_internal._0_4_ = local_2a8.depthStencil.depth;
  local_58.m_data.object.m_internal._4_4_ = local_2a8.depthStencil.stencil;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_2a8.depthStencil);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_2a8.depthStencil,vk,device,
                    (VkCommandPool)local_58.m_data.object.m_internal);
  local_258.m_data.deleter.m_device = local_298;
  local_258.m_data.deleter.m_pool.m_internal = (deUint64)pVStack_290;
  local_258.m_data.object = (VkCommandBuffer_s *)local_2a8.depthStencil;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_2a8.depthStencil);
  local_150 = *(undefined8 *)(caseDef->renderSize).m_data;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar8 = 0; iVar8 < caseDef->numLayers; iVar8 = iVar8 + 1) {
    subresourceRange.levelCount = 1;
    subresourceRange.aspectMask = 1;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.baseArrayLayer = iVar8;
    subresourceRange.layerCount = 1;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_98,vk,device,colorImage,
                  VK_IMAGE_VIEW_TYPE_2D,caseDef->colorFormat,subresourceRange);
    ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_98.m_data.deleter.m_device;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_98.m_data.deleter.m_allocator;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         local_98.m_data.object.m_internal;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_98.m_data.deleter.m_deviceIface;
    local_98.m_data.object.m_internal = 0;
    local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_98.m_data.deleter.m_device = (VkDevice)0x0;
    local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
               &local_2a8.depthStencil,ptr);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                *)&colorAttachments,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
               &local_2a8.depthStencil);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
               &local_2a8.depthStencil);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_98);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    push_back(&attachmentHandles,
              (value_type *)
              colorAttachments.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
  }
  if (pipeline::(anonymous_namespace)::genTriangleVertices()::data == '\0') {
    iVar8 = __cxa_guard_acquire(&pipeline::(anonymous_namespace)::genTriangleVertices()::data);
    if (iVar8 != 0) {
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._0_8_ = 0xbf800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._8_8_ = 0x3f80000000000000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._16_4_ = 0x3f800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._20_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._24_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._28_4_ = 0x3f800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._32_8_ = 0x3e4ccccd3f4ccccd;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._40_8_ = 0x3f80000000000000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._48_4_ = 0x3f800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._52_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._56_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._60_4_ = 0x3f800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._64_4_ = 0x3f4ccccd;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._68_4_ = 0xbe4ccccd;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._72_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._76_4_ = 0x3f800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._80_4_ = 0x3f800000;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._84_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._88_4_ = 0;
      pipeline::(anonymous_namespace)::genTriangleVertices()::data._92_4_ = 0x3f800000;
      __cxa_guard_release(&pipeline::(anonymous_namespace)::genTriangleVertices()::data);
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,(Vertex4RGBA *)pipeline::(anonymous_namespace)::genTriangleVertices()::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genTriangleVertices()::data,
             (allocator_type *)&local_2a8.depthStencil);
  bufferSize = (long)vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_2a8.depthStencil,vk,device,bufferSize,
             0x80);
  local_b8.m_data.deleter.m_device = local_298;
  local_b8.m_data.deleter.m_allocator = pVStack_290;
  local_b8.m_data.object.m_internal._0_4_ = local_2a8.depthStencil.depth;
  local_b8.m_data.object.m_internal._4_4_ = local_2a8.depthStencil.stencil;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_2a8.depthStencil);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_2a8.depthStencil
             ,vk,device,local_148,(VkBuffer)local_b8.m_data.object.m_internal,(MemoryRequirement)0x1
            );
  vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)local_2a8.depthStencil;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_2a8._8_8_;
  local_2a8 = (value_type)(auVar4 << 0x40);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &local_2a8.depthStencil);
  memcpy((vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr)->m_hostPtr,
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pPVar2 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"vert",(allocator<char> *)&local_d8);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)local_238);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_2a8.depthStencil,vk,device,pPVar6,0);
  local_78.m_data.deleter.m_device = local_298;
  local_78.m_data.deleter.m_allocator = pVStack_290;
  local_78.m_data.object.m_internal._0_4_ = local_2a8.depthStencil.depth;
  local_78.m_data.object.m_internal._4_4_ = local_2a8.depthStencil.stencil;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_2a8.depthStencil);
  std::__cxx11::string::~string((string *)local_238);
  pPVar2 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"frag",(allocator<char> *)&local_178);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)local_238);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_2a8.depthStencil,vk,device,pPVar6,0);
  local_d8.m_data.deleter.m_device = local_298;
  local_d8.m_data.deleter.m_allocator = pVStack_290;
  local_d8.m_data.object.m_internal._0_4_ = local_2a8.depthStencil.depth;
  local_d8.m_data.object.m_internal._4_4_ = local_2a8.depthStencil.stencil;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_2a8.depthStencil);
  std::__cxx11::string::~string((string *)local_238);
  __n = (ulong)(uint)caseDef->numLayers;
  local_238._0_4_ = 0;
  uVar1 = caseDef->colorFormat;
  uVar3 = caseDef->numSamples;
  local_238._12_4_ = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_238._16_4_ = 0;
  local_238._20_4_ = 2;
  local_238._24_4_ = 1;
  local_238._28_4_ = 0;
  VStack_218 = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_238._4_4_ = uVar1;
  local_238._8_4_ = uVar3;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             &pipelines,__n,(value_type *)local_238,(allocator_type *)&local_2a8.depthStencil);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             &clearValues,__n,(allocator_type *)&local_2a8.depthStencil);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = 0;
  for (lVar7 = 0; __n << 3 != lVar7; lVar7 = lVar7 + 8) {
    local_288 = (long)clearValues.
                      super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar7;
    *(int *)((long)clearValues.
                   super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar7) = iVar8;
    *(undefined4 *)
     ((long)clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar7 + 4) = 2;
    local_298 = (VkDevice)0x0;
    pVStack_280 = (pointer)0x0;
    local_268 = 0;
    local_278 = 0;
    pVStack_270 = (pointer)0x0;
    local_2a8 = (value_type)ZEXT816(0);
    pVStack_290 = (VkAllocationCallbacks *)0x1;
    std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::push_back
              (&subpasses,(value_type *)&local_2a8.depthStencil);
    iVar8 = iVar8 + 1;
  }
  local_2a8.depthStencil.depth = 5.32493e-44;
  local_2a8._8_8_ = 0;
  local_298._4_4_ =
       (undefined4)
       (((long)pipelines.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)pipelines.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_298._0_4_ = 0;
  pVStack_290 = (VkAllocationCallbacks *)
                pipelines.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_288 = CONCAT44(local_288._4_4_,
                       (int)(((long)subpasses.
                                    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)subpasses.
                                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x48));
  pVStack_280 = subpasses.
                super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_278 = local_278 & 0xffffffff00000000;
  pVStack_270 = (pointer)0x0;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_138,vk,device,
             (VkRenderPassCreateInfo *)&local_2a8.depthStencil,(VkAllocationCallbacks *)0x0);
  std::_Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
  ~_Vector_base(&subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               );
  std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
  ~_Vector_base((_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                 *)&clearValues);
  std::_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  ~_Vector_base((_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                 *)&pipelines);
  local_178.m_data.object.m_internal = local_138.m_data.object.m_internal;
  local_178.m_data.deleter.m_deviceIface = local_138.m_data.deleter.m_deviceIface;
  local_178.m_data.deleter.m_device = local_138.m_data.deleter.m_device;
  local_178.m_data.deleter.m_allocator = local_138.m_data.deleter.m_allocator;
  local_138.m_data.object.m_internal = 0;
  local_138.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_138.m_data.deleter.m_device = (VkDevice)0x0;
  local_138.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_138);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&local_2a8.depthStencil,vk,device,
                  (VkRenderPass)local_178.m_data.object.m_internal,caseDef->numLayers,
                  attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(caseDef->renderSize).m_data[0],
                  (caseDef->renderSize).m_data[1],1);
  local_238._16_4_ = (undefined4)local_298;
  local_238._20_4_ = local_298._4_4_;
  local_238._24_4_ = SUB84(pVStack_290,0);
  local_238._28_4_ = (undefined4)((ulong)pVStack_290 >> 0x20);
  local_238._0_4_ = local_2a8._0_4_;
  local_238._4_4_ = local_2a8._4_4_;
  local_238._8_4_ = local_2a8._8_4_;
  local_238._12_4_ = local_2a8._12_4_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_2a8.depthStencil);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_2a8.depthStencil,vk,device);
  local_138.m_data.deleter.m_device = local_298;
  local_138.m_data.deleter.m_allocator = pVStack_290;
  local_138.m_data.object.m_internal._0_4_ = local_2a8.depthStencil.depth;
  local_138.m_data.object.m_internal._4_4_ = local_2a8.depthStencil.stencil;
  local_138.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  local_2a8 = (value_type)ZEXT816(0);
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_2a8.depthStencil);
  vertexModule.m_internal = local_78.m_data.object.m_internal;
  fragmentModule.m_internal = local_d8.m_data.object.m_internal;
  pipelineLayout.m_internal = local_138.m_data.object.m_internal;
  renderPass.m_internal = local_178.m_data.object.m_internal;
  dVar5 = caseDef->numLayers;
  tcu::Vector<int,_2>::Vector(&local_140,&caseDef->renderSize);
  makeGraphicsPipelines
            (&pipelines,vk,device,dVar5,(VkPipelineLayout)pipelineLayout.m_internal,
             (VkRenderPass)renderPass.m_internal,(VkShaderModule)vertexModule.m_internal,
             (VkShaderModule)fragmentModule.m_internal,(IVec2)&local_140,caseDef->numSamples,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  beginCommandBuffer(vk,local_258.m_data.object);
  iVar8 = caseDef->numLayers;
  local_2a8 = getClearValue(caseDef->colorFormat);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            (&clearValues,(long)iVar8,&local_2a8,(allocator_type *)&subpasses);
  local_2a8.depthStencil.depth = 6.02558e-44;
  local_2a8._8_8_ = 0;
  local_298 = (VkDevice)local_178.m_data.object.m_internal;
  pVStack_290 = (VkAllocationCallbacks *)CONCAT44(local_238._4_4_,local_238._0_4_);
  local_288 = 0;
  pVStack_280 = (pointer)local_150;
  local_278 = CONCAT44(local_278._4_4_,
                       (int)((ulong)((long)clearValues.
                                           super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)clearValues.
                                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4));
  pVStack_270 = clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_258.m_data.object,&local_2a8,0);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_258.m_data.object,0,1,&local_b8);
  lVar7 = 0;
  for (lVar9 = 0; lVar9 < caseDef->numLayers; lVar9 = lVar9 + 1) {
    if (lVar7 != 0) {
      (*vk->_vptr_DeviceInterface[0x75])(vk,local_258.m_data.object,0);
    }
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_258.m_data.object,0,
               **(undefined8 **)
                 ((long)&(pipelines.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7));
    (*vk->_vptr_DeviceInterface[0x59])
              (vk,local_258.m_data.object,
               (ulong)((long)vertices.
                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5,1,0,0);
    lVar7 = lVar7 + 0x10;
  }
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_258.m_data.object);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_258.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x34d);
  submitCommandsAndWait(vk,device,local_158,local_258.m_data.object);
  std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
            (&clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipelines);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_138);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_238);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_178);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_b8);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               );
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&colorAttachments);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_258);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_58);
  return;
}

Assistant:

void renderMultisampledImage (Context& context, const CaseDef& caseDef, const VkImage colorImage)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	{
		// Create an image view (attachment) for each layer of the image
		std::vector<ImageViewSp>	colorAttachments;
		std::vector<VkImageView>	attachmentHandles;
		for (int i = 0; i < caseDef.numLayers; ++i)
		{
			colorAttachments.push_back(makeSharedPtr(makeImageView(
				vk, device, colorImage, VK_IMAGE_VIEW_TYPE_2D, caseDef.colorFormat, makeColorSubresourceRange(i, 1))));
			attachmentHandles.push_back(**colorAttachments.back());
		}

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genTriangleVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		const Unique<VkShaderModule>	vertexModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeMultisampleRenderPass	(vk, device, caseDef.colorFormat, caseDef.numSamples, caseDef.numLayers));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer			(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
																					 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout			(vk, device));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines		(vk, device, caseDef.numLayers, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																					 caseDef.renderSize, caseDef.numSamples, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST));

		beginCommandBuffer(vk, *cmdBuffer);

		const std::vector<VkClearValue> clearValues(caseDef.numLayers, getClearValue(caseDef.colorFormat));

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*renderPass,									// VkRenderPass            renderPass;
			*framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			static_cast<deUint32>(clearValues.size()),		// uint32_t                clearValueCount;
			&clearValues[0],								// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		for (int layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
		{
			if (layerNdx != 0)
				vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines[layerNdx]);

			vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		}

		vk.cmdEndRenderPass(*cmdBuffer);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}
}